

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SHA1.cpp
# Opt level: O0

bool __thiscall CSHA1::HashFile(CSHA1 *this,char *szFileName)

{
  FILE *__stream;
  ulong uVar1;
  FILE *fIn;
  uchar uData [8000];
  ulong local_40;
  unsigned_long i;
  unsigned_long ulBlocks;
  unsigned_long ulRest;
  unsigned_long ulFileSize;
  char *szFileName_local;
  CSHA1 *this_local;
  
  if (szFileName == (char *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    __stream = fopen(szFileName,"rb");
    if (__stream == (FILE *)0x0) {
      this_local._7_1_ = false;
    }
    else {
      fseek(__stream,0,2);
      uVar1 = ftell(__stream);
      fseek(__stream,0,0);
      if (uVar1 == 0) {
        i = 0;
        ulBlocks = 0;
      }
      else {
        i = uVar1 / 8000;
        ulBlocks = uVar1 % 8000;
      }
      for (local_40 = 0; local_40 < i; local_40 = local_40 + 1) {
        fread(&fIn,1,8000,__stream);
        Update(this,(uchar *)&fIn,8000);
      }
      if (ulBlocks != 0) {
        fread(&fIn,1,ulBlocks,__stream);
        Update(this,(uchar *)&fIn,(uint)ulBlocks);
      }
      fclose(__stream);
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool CSHA1::HashFile(char *szFileName)
{
	unsigned long ulFileSize, ulRest, ulBlocks;
	unsigned long i;
	UINT_8 uData[SHA1_MAX_FILE_BUFFER];
	FILE *fIn;

	if(szFileName == NULL) return false;

	fIn = fopen(szFileName, "rb");
	if(fIn == NULL) return false;

	fseek(fIn, 0, SEEK_END);
	ulFileSize = (unsigned long)ftell(fIn);
	fseek(fIn, 0, SEEK_SET);

	if(ulFileSize != 0)
	{
		ulBlocks = ulFileSize / SHA1_MAX_FILE_BUFFER;
		ulRest = ulFileSize % SHA1_MAX_FILE_BUFFER;
	}
	else
	{
		ulBlocks = 0;
		ulRest = 0;
	}

	for(i = 0; i < ulBlocks; i++)
	{
		fread(uData, 1, SHA1_MAX_FILE_BUFFER, fIn);
		Update((UINT_8 *)uData, SHA1_MAX_FILE_BUFFER);
	}

	if(ulRest != 0)
	{
		fread(uData, 1, ulRest, fIn);
		Update((UINT_8 *)uData, ulRest);
	}

	fclose(fIn); fIn = NULL;
	return true;
}